

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.h
# Opt level: O1

string * __thiscall
google::protobuf::internal::ArenaStringPtr::MutableNoCopy_abi_cxx11_
          (ArenaStringPtr *this,Arena *arena)

{
  void *pvVar1;
  pointer pcVar2;
  undefined8 uVar3;
  string *psVar4;
  string *psVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  TaggedStringPtr *this_00;
  TaggedStringPtr local_10 [2];
  
  pvVar1 = (this->tagged_ptr_).ptr_;
  if (((ulong)pvVar1 & 2) != 0) {
    return (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
  }
  if (((ulong)pvVar1 & 1) != 0) {
    this_00 = local_10;
    MutableNoCopy_abi_cxx11_((ArenaStringPtr *)this_00);
    pvVar1 = ((TaggedStringPtr *)&this_00->ptr_)->ptr_;
    if (((ulong)pvVar1 & 3) == 0) {
      psVar4 = (string *)0x0;
    }
    else {
      psVar4 = (string *)((ulong)pvVar1 & 0xfffffffffffffffc);
      if (((ulong)pvVar1 & 1) != 0) {
        psVar5 = (string *)operator_new(0x20);
        (psVar5->_M_dataplus)._M_p = (pointer)&psVar5->field_2;
        pcVar2 = (psVar4->_M_dataplus)._M_p;
        if (((ulong)pvVar1 & 2) == 0) {
          std::__cxx11::string::_M_construct<char*>
                    ((string *)psVar5,pcVar2,pcVar2 + psVar4->_M_string_length);
          psVar4 = psVar5;
        }
        else {
          paVar6 = &psVar4->field_2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)pcVar2 == paVar6) {
            uVar3 = *(undefined8 *)((long)&psVar4->field_2 + 8);
            (psVar5->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
            *(undefined8 *)((long)&psVar5->field_2 + 8) = uVar3;
          }
          else {
            (psVar5->_M_dataplus)._M_p = pcVar2;
            (psVar5->field_2)._M_allocated_capacity = paVar6->_M_allocated_capacity;
          }
          psVar5->_M_string_length = psVar4->_M_string_length;
          (psVar4->_M_dataplus)._M_p = (pointer)paVar6;
          psVar4->_M_string_length = 0;
          (psVar4->field_2)._M_local_buf[0] = '\0';
          psVar4 = psVar5;
        }
      }
      ((TaggedStringPtr *)&this_00->ptr_)->ptr_ = &fixed_address_empty_string_abi_cxx11_;
    }
    return psVar4;
  }
  psVar4 = NewString<>(this,arena);
  return psVar4;
}

Assistant:

uintptr_t as_int() const { return reinterpret_cast<uintptr_t>(ptr_); }